

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O3

void Close(FILE *file)

{
  int iVar1;
  ostream *poVar2;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (file != (FILE *)0x0) {
    iVar1 = fclose((FILE *)file);
    if (iVar1 == -1) {
      local_5c.severity_ = FATAL;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,"");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Close","");
      poVar2 = Logger::Start(FATAL,&local_38,0x97,&local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Error: invoke fclose().",0x17);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      Logger::~Logger(&local_5c);
    }
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_5c.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
             ,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Close","");
  poVar2 = Logger::Start(ERR,&local_38,0x95,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x95);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"file",4);
  std::operator<<(poVar2," == NULL \n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline void Close(FILE *file) {
  CHECK_NOTNULL(file);
  if (fclose(file) == EOF) {
    LOG(FATAL) << "Error: invoke fclose().";
  }
}